

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct16_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  __m128i alVar3;
  __m128i _in0_2;
  undefined1 auVar4 [16];
  __m128i _in1_3;
  __m128i _in1;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i _in0;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i _in1_2;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  __m128i _in1_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  __m128i _in0_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i _in0_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i _in0_4;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar16 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  
  alVar3 = input[2];
  auVar8 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  auVar41._0_4_ = auVar8._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar8 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  auVar9 = pmulhrsw(auVar41,(undefined1  [16])input[1]);
  auVar4 = pmulhrsw(auVar8,(undefined1  [16])input[1]);
  auVar8 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  auVar40._0_4_ = auVar8._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar8 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  uVar1 = auVar8._0_4_;
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar5 = pmulhrsw(auVar40,(undefined1  [16])input[7]);
  auVar48 = pmulhrsw(auVar47,(undefined1  [16])input[7]);
  auVar8 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  uVar1 = auVar8._0_4_;
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar8 = pshuflw(auVar8,ZEXT416(0x70e0),0);
  auVar49._0_4_ = auVar8._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar22 = pmulhrsw(auVar21,(undefined1  [16])input[5]);
  auVar13 = pmulhrsw(auVar49,(undefined1  [16])input[5]);
  auVar8 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar1 = auVar8._0_4_;
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar8 = pshuflw(auVar8,ZEXT416(0x7a80),0);
  auVar36._0_4_ = auVar8._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar40 = pmulhrsw(auVar39,(undefined1  [16])input[3]);
  auVar37 = pmulhrsw(auVar36,(undefined1  [16])input[3]);
  auVar8 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar8._0_4_;
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar6 = pshuflw(auVar8,ZEXT416(0x7d88),0);
  uVar1 = auVar6._0_4_;
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar52 = pmulhrsw(auVar51,(undefined1  [16])alVar3);
  auVar58 = pmulhrsw(auVar57,(undefined1  [16])alVar3);
  auVar8 = pshuflw((undefined1  [16])alVar3,ZEXT416(0xffffb8e0),0);
  auVar2._0_4_ = auVar8._0_4_;
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar8 = pshuflw(auVar6,ZEXT416(0x6a70),0);
  auVar42._0_4_ = auVar8._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  auVar6 = pmulhrsw(auVar2,(undefined1  [16])input[6]);
  auVar7 = pmulhrsw(auVar42,(undefined1  [16])input[6]);
  auVar8 = paddsw(auVar9,auVar5);
  auVar10 = psubsw(auVar9,auVar5);
  auVar42 = psubsw(auVar40,auVar22);
  auVar41 = paddsw(auVar40,auVar22);
  auVar2 = paddsw(auVar37,auVar13);
  auVar40 = psubsw(auVar37,auVar13);
  auVar22 = psubsw(auVar4,auVar48);
  auVar49 = paddsw(auVar48,auVar4);
  auVar4 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  uVar1 = auVar4._0_4_;
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar4 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  uVar1 = auVar4._0_4_;
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar65 = pmulhrsw(auVar64,(undefined1  [16])input[4]);
  auVar5 = pmulhrsw(auVar13,(undefined1  [16])input[4]);
  auVar4 = paddsw(auVar52,auVar6);
  auVar53 = psubsw(auVar52,auVar6);
  auVar9 = psubsw(auVar58,auVar7);
  auVar37 = paddsw(auVar7,auVar58);
  auVar16._0_12_ = auVar10._0_12_;
  auVar16._12_2_ = auVar10._6_2_;
  auVar16._14_2_ = auVar22._6_2_;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = auVar10._0_10_;
  auVar15._10_2_ = auVar22._4_2_;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = auVar10._0_8_;
  auVar14._8_2_ = auVar10._4_2_;
  auVar61._8_8_ = auVar14._8_8_;
  auVar61._6_2_ = auVar22._2_2_;
  auVar61._4_2_ = auVar10._2_2_;
  auVar61._0_2_ = auVar10._0_2_;
  auVar61._2_2_ = auVar22._0_2_;
  auVar59._2_2_ = auVar22._8_2_;
  auVar59._0_2_ = auVar10._8_2_;
  auVar59._4_2_ = auVar10._10_2_;
  auVar59._6_2_ = auVar22._10_2_;
  auVar59._8_2_ = auVar10._12_2_;
  auVar59._10_2_ = auVar22._12_2_;
  auVar59._12_2_ = auVar10._14_2_;
  auVar59._14_2_ = auVar22._14_2_;
  auVar6._8_4_ = 0xec8061f;
  auVar6._0_8_ = 0xec8061f0ec8061f;
  auVar6._12_4_ = 0xec8061f;
  auVar13 = pmaddwd(auVar61,auVar6);
  auVar6 = pmaddwd(auVar59,auVar6);
  auVar48._8_4_ = 0x61ff138;
  auVar48._0_8_ = 0x61ff138061ff138;
  auVar48._12_4_ = 0x61ff138;
  auVar7 = pmaddwd(auVar61,auVar48);
  auVar22 = pmaddwd(auVar59,auVar48);
  auVar60._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar61 = packssdw(auVar60,auVar23);
  auVar17._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar52 = packssdw(auVar17,auVar11);
  auVar58._0_12_ = auVar42._0_12_;
  auVar58._12_2_ = auVar42._6_2_;
  auVar58._14_2_ = auVar40._6_2_;
  auVar45._12_4_ = auVar58._12_4_;
  auVar45._0_10_ = auVar42._0_10_;
  auVar45._10_2_ = auVar40._4_2_;
  auVar46._10_6_ = auVar45._10_6_;
  auVar46._0_8_ = auVar42._0_8_;
  auVar46._8_2_ = auVar42._4_2_;
  auVar50._8_8_ = auVar46._8_8_;
  auVar50._6_2_ = auVar40._2_2_;
  auVar50._4_2_ = auVar42._2_2_;
  auVar50._0_2_ = auVar42._0_2_;
  auVar50._2_2_ = auVar40._0_2_;
  auVar43._2_2_ = auVar40._8_2_;
  auVar43._0_2_ = auVar42._8_2_;
  auVar43._4_2_ = auVar42._10_2_;
  auVar43._6_2_ = auVar40._10_2_;
  auVar43._8_2_ = auVar42._12_2_;
  auVar43._10_2_ = auVar40._12_2_;
  auVar43._12_2_ = auVar42._14_2_;
  auVar43._14_2_ = auVar40._14_2_;
  auVar24._8_4_ = 0xf138f9e1;
  auVar24._0_8_ = 0xf138f9e1f138f9e1;
  auVar24._12_4_ = 0xf138f9e1;
  auVar6 = pmaddwd(auVar50,auVar24);
  auVar22 = pmaddwd(auVar24,auVar43);
  auVar13 = pmaddwd(auVar50,auVar48);
  auVar7 = pmaddwd(auVar43,auVar48);
  auVar12._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar22._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar22._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar22._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar22._12_4_ + 0x800 >> 0xc;
  auVar48 = packssdw(auVar12,auVar25);
  auVar6 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  uVar1 = auVar6._0_4_;
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar6 = pmulhrsw(auVar38,(undefined1  [16])*input);
  auVar56._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar40 = packssdw(auVar56,auVar44);
  auVar45 = paddsw(auVar6,auVar5);
  auVar59 = psubsw(auVar6,auVar5);
  auVar58 = paddsw(auVar6,auVar65);
  auVar42 = psubsw(auVar6,auVar65);
  auVar29._0_12_ = auVar53._0_12_;
  auVar29._12_2_ = auVar53._6_2_;
  auVar29._14_2_ = auVar9._6_2_;
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._0_10_ = auVar53._0_10_;
  auVar28._10_2_ = auVar9._4_2_;
  auVar27._10_6_ = auVar28._10_6_;
  auVar27._0_8_ = auVar53._0_8_;
  auVar27._8_2_ = auVar53._4_2_;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._6_2_ = auVar9._2_2_;
  auVar26._4_2_ = auVar53._2_2_;
  auVar26._0_2_ = auVar53._0_2_;
  auVar26._2_2_ = auVar9._0_2_;
  auVar54._2_2_ = auVar9._8_2_;
  auVar54._0_2_ = auVar53._8_2_;
  auVar54._4_2_ = auVar53._10_2_;
  auVar54._6_2_ = auVar9._10_2_;
  auVar54._8_2_ = auVar53._12_2_;
  auVar54._10_2_ = auVar9._12_2_;
  auVar54._12_2_ = auVar53._14_2_;
  auVar54._14_2_ = auVar9._14_2_;
  auVar66._8_4_ = 0xb50f4b0;
  auVar66._0_8_ = 0xb50f4b00b50f4b0;
  auVar66._12_4_ = 0xb50f4b0;
  auVar5 = pmaddwd(auVar26,auVar66);
  auVar6 = pmaddwd(auVar54,auVar66);
  auVar10._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar22._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar22._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar22._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar22._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar10,auVar22);
  auVar7._8_4_ = 0xb500b50;
  auVar7._0_8_ = 0xb500b500b500b50;
  auVar7._12_4_ = 0xb500b50;
  auVar6 = pmaddwd(auVar26,auVar7);
  auVar9 = pmaddwd(auVar54,auVar7);
  auVar30._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar10 = packssdw(auVar30,auVar55);
  auVar13 = paddsw(auVar8,auVar41);
  auVar50 = psubsw(auVar8,auVar41);
  auVar8 = paddsw(auVar61,auVar48);
  auVar41 = psubsw(auVar61,auVar48);
  auVar9 = psubsw(auVar49,auVar2);
  auVar2 = paddsw(auVar49,auVar2);
  auVar6 = psubsw(auVar52,auVar40);
  auVar22 = paddsw(auVar40,auVar52);
  auVar46 = paddsw(auVar45,auVar37);
  auVar40 = psubsw(auVar45,auVar37);
  auVar56 = paddsw(auVar58,auVar10);
  auVar58 = psubsw(auVar58,auVar10);
  auVar45 = paddsw(auVar42,auVar5);
  auVar48 = psubsw(auVar42,auVar5);
  auVar10 = paddsw(auVar59,auVar4);
  auVar42 = psubsw(auVar59,auVar4);
  auVar65._0_12_ = auVar41._0_12_;
  auVar65._12_2_ = auVar41._6_2_;
  auVar65._14_2_ = auVar6._6_2_;
  auVar19._12_4_ = auVar65._12_4_;
  auVar19._0_10_ = auVar41._0_10_;
  auVar19._10_2_ = auVar6._4_2_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = auVar41._0_8_;
  auVar18._8_2_ = auVar41._4_2_;
  auVar53._8_8_ = auVar18._8_8_;
  auVar53._6_2_ = auVar6._2_2_;
  auVar53._4_2_ = auVar41._2_2_;
  auVar53._0_2_ = auVar41._0_2_;
  auVar53._2_2_ = auVar6._0_2_;
  auVar62._2_2_ = auVar6._8_2_;
  auVar62._0_2_ = auVar41._8_2_;
  auVar62._4_2_ = auVar41._10_2_;
  auVar62._6_2_ = auVar6._10_2_;
  auVar62._8_2_ = auVar41._12_2_;
  auVar62._10_2_ = auVar6._12_2_;
  auVar62._12_2_ = auVar41._14_2_;
  auVar62._14_2_ = auVar6._14_2_;
  auVar6 = pmaddwd(auVar53,auVar66);
  auVar4 = pmaddwd(auVar62,auVar66);
  auVar37._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar37,auVar5);
  auVar4 = pmaddwd(auVar53,auVar7);
  auVar5 = pmaddwd(auVar62,auVar7);
  auVar20._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar63._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar37 = packssdw(auVar20,auVar63);
  auVar34._0_12_ = auVar50._0_12_;
  auVar34._12_2_ = auVar50._6_2_;
  auVar34._14_2_ = auVar9._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar50._0_10_;
  auVar33._10_2_ = auVar9._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar50._0_8_;
  auVar32._8_2_ = auVar50._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = auVar9._2_2_;
  auVar31._4_2_ = auVar50._2_2_;
  auVar31._0_2_ = auVar50._0_2_;
  auVar31._2_2_ = auVar9._0_2_;
  auVar4._2_2_ = auVar9._8_2_;
  auVar4._0_2_ = auVar50._8_2_;
  auVar4._4_2_ = auVar50._10_2_;
  auVar4._6_2_ = auVar9._10_2_;
  auVar4._8_2_ = auVar50._12_2_;
  auVar4._10_2_ = auVar9._12_2_;
  auVar4._12_2_ = auVar50._14_2_;
  auVar4._14_2_ = auVar9._14_2_;
  auVar5 = pmaddwd(auVar31,auVar66);
  auVar50 = pmaddwd(auVar66,auVar4);
  auVar9 = pmaddwd(auVar31,auVar7);
  auVar4 = pmaddwd(auVar4,auVar7);
  auVar52._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar67._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar52,auVar67);
  auVar35._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar35,auVar9);
  alVar3 = (__m128i)paddsw(auVar46,auVar2);
  *output = alVar3;
  alVar3 = (__m128i)psubsw(auVar46,auVar2);
  output[0xf] = alVar3;
  alVar3 = (__m128i)paddsw(auVar56,auVar22);
  output[1] = alVar3;
  alVar3 = (__m128i)psubsw(auVar56,auVar22);
  output[0xe] = alVar3;
  alVar3 = (__m128i)paddsw(auVar45,auVar37);
  output[2] = alVar3;
  alVar3 = (__m128i)psubsw(auVar45,auVar37);
  output[0xd] = alVar3;
  alVar3 = (__m128i)paddsw(auVar10,auVar4);
  output[3] = alVar3;
  alVar3 = (__m128i)psubsw(auVar10,auVar4);
  output[0xc] = alVar3;
  alVar3 = (__m128i)paddsw(auVar42,auVar5);
  output[4] = alVar3;
  alVar3 = (__m128i)psubsw(auVar42,auVar5);
  output[0xb] = alVar3;
  alVar3 = (__m128i)paddsw(auVar48,auVar6);
  output[5] = alVar3;
  alVar3 = (__m128i)psubsw(auVar48,auVar6);
  output[10] = alVar3;
  alVar3 = (__m128i)paddsw(auVar58,auVar8);
  output[6] = alVar3;
  alVar3 = (__m128i)psubsw(auVar58,auVar8);
  output[9] = alVar3;
  alVar3 = (__m128i)paddsw(auVar40,auVar13);
  output[7] = alVar3;
  alVar3 = (__m128i)psubsw(auVar40,auVar13);
  output[8] = alVar3;
  return;
}

Assistant:

static void idct16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[2] = input[4];
  x[4] = input[2];
  x[6] = input[6];
  x[8] = input[1];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[7];

  // stage 2
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);

  // stage 3
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}